

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_exit_example.cpp
# Opt level: O0

void foo5(int *a)

{
  ostream *poVar1;
  undefined1 local_28 [8];
  saver_exit<int_&> state_saver;
  int *a_local;
  
  state_saver.super_state_saver<int_&,_nstd::detail::on_exit_policy>._16_8_ = a;
  nstd::saver_exit<int_&>::state_saver((saver_exit<int_&> *)local_28,a);
  *(undefined4 *)state_saver.super_state_saver<int_&,_nstd::detail::on_exit_policy>._16_8_ = 5;
  poVar1 = std::operator<<((ostream *)&std::cout,"foo5 a = ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*(int *)state_saver.
                                     super_state_saver<int_&,_nstd::detail::on_exit_policy>._16_8_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  nstd::detail::state_saver<int_&,_nstd::detail::on_exit_policy>::dismiss
            ((state_saver<int_&,_nstd::detail::on_exit_policy> *)local_28);
  poVar1 = std::operator<<((ostream *)&std::cout,"foo5 state_saver::dismiss");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  nstd::detail::state_saver<int_&,_nstd::detail::on_exit_policy>::restore<int>
            ((state_saver<int_&,_nstd::detail::on_exit_policy> *)local_28);
  poVar1 = std::operator<<((ostream *)&std::cout,"foo5 state_saver::restore");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"foo5 a = ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*(int *)state_saver.
                                     super_state_saver<int_&,_nstd::detail::on_exit_policy>._16_8_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  nstd::saver_exit<int_&>::~saver_exit((saver_exit<int_&> *)local_28);
  return;
}

Assistant:

void foo5(int& a) {
  MAKE_SAVER_EXIT(state_saver, a); // Custom state saver on exit.

  a = 5;
  std::cout << "foo5 a = " << a << std::endl;

  state_saver.dismiss(); // Dismiss, state will not automatically restored.
  std::cout << "foo5 state_saver::dismiss" << std::endl;

  state_saver.restore(); // Restore state.
  std::cout << "foo5 state_saver::restore" << std::endl;
  std::cout << "foo5 a = " << a << std::endl;
  // Original state will not automatically restored, on scope leave.
}